

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_casts.cpp
# Opt level: O2

bool duckdb::ArrayToListCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  undefined1 uVar1;
  bool bVar2;
  BoundCastData *pBVar3;
  idx_t iVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  list_entry_t *plVar7;
  idx_t iVar8;
  idx_t idx;
  uint64_t *puVar9;
  
  pBVar3 = optional_ptr<duckdb::BoundCastData,_true>::operator->(&parameters->cast_data);
  Vector::Flatten(source,count);
  iVar4 = ArrayType::GetSize(&source->type);
  iVar8 = iVar4 * count;
  ListVector::Reserve(result,iVar8);
  ListVector::SetListSize(result,iVar8);
  pVVar5 = ArrayVector::GetEntry(source);
  pVVar6 = ListVector::GetEntry(result);
  uVar1 = (*(code *)pBVar3[1]._vptr_BoundCastData)(pVVar5,pVVar6,iVar8);
  plVar7 = ListVector::GetData(result);
  puVar9 = &plVar7->length;
  iVar8 = 0;
  for (idx = 0; count != idx; idx = idx + 1) {
    bVar2 = FlatVector::IsNull(source,idx);
    if (bVar2) {
      FlatVector::SetNull(result,idx,true);
    }
    else {
      ((list_entry_t *)(puVar9 + -1))->offset = iVar8;
      *puVar9 = iVar4;
    }
    iVar8 = iVar8 + iVar4;
    puVar9 = puVar9 + 2;
  }
  if (count == 1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return (bool)uVar1;
}

Assistant:

static bool ArrayToListCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &cast_data = parameters.cast_data->Cast<ArrayBoundCastData>();

	// FIXME: dont flatten
	source.Flatten(count);

	auto array_size = ArrayType::GetSize(source.GetType());
	auto child_count = count * array_size;

	ListVector::Reserve(result, child_count);
	ListVector::SetListSize(result, child_count);

	auto &source_child = ArrayVector::GetEntry(source);
	auto &result_child = ListVector::GetEntry(result);

	CastParameters child_parameters(parameters, cast_data.child_cast_info.cast_data, parameters.local_state);
	bool all_ok = cast_data.child_cast_info.function(source_child, result_child, child_count, child_parameters);

	auto list_data = ListVector::GetData(result);
	for (idx_t i = 0; i < count; i++) {
		if (FlatVector::IsNull(source, i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		list_data[i].offset = i * array_size;
		list_data[i].length = array_size;
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	return all_ok;
}